

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillCMakeEnvironmentPath(cmFindBase *this)

{
  undefined8 uVar1;
  bool bVar2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string var;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  var.field_2._8_8_ =
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                    &cmFindCommon::PathLabel::CMakeEnvironment);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"CMAKE_",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::operator+=
            ((string *)local_38,(string *)&(this->super_cmFindCommon).CMakePathName);
  std::__cxx11::string::operator+=((string *)local_38,"_PATH");
  uVar1 = var.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_PREFIX_PATH",&local_71);
  cmSearchPath::AddEnvPrefixPath((cmSearchPath *)uVar1,&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  cmSearchPath::AddEnvPath((cmSearchPath *)var.field_2._8_8_,(string *)local_38);
  bVar2 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  uVar1 = var.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_APPBUNDLE_PATH",&local_99);
    cmSearchPath::AddEnvPath((cmSearchPath *)uVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_FRAMEWORK_PATH",&local_c1);
    cmSearchPath::AddEnvPath((cmSearchPath *)uVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  cmSearchPath::AddSuffixes
            ((cmSearchPath *)var.field_2._8_8_,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFindBase::FillCMakeEnvironmentPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];

  // Add CMAKE_*_PATH environment variables
  std::string var = "CMAKE_";
  var += this->CMakePathName;
  var += "_PATH";
  paths.AddEnvPrefixPath("CMAKE_PREFIX_PATH");
  paths.AddEnvPath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}